

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O0

void Abc_TtAndSharp(word *pOut,word *pIn1,word *pIn2,int nWords,int fCompl)

{
  int local_2c;
  int w;
  int fCompl_local;
  int nWords_local;
  word *pIn2_local;
  word *pIn1_local;
  word *pOut_local;
  
  if (fCompl == 0) {
    for (local_2c = 0; local_2c < nWords; local_2c = local_2c + 1) {
      pOut[local_2c] = pIn1[local_2c] & pIn2[local_2c];
    }
  }
  else {
    for (local_2c = 0; local_2c < nWords; local_2c = local_2c + 1) {
      pOut[local_2c] = pIn1[local_2c] & (pIn2[local_2c] ^ 0xffffffffffffffff);
    }
  }
  return;
}

Assistant:

static inline void Abc_TtAndSharp( word * pOut, word * pIn1, word * pIn2, int nWords, int fCompl )
{
    int w;
    if ( fCompl )
        for ( w = 0; w < nWords; w++ )
            pOut[w] = pIn1[w] & ~pIn2[w];
    else
        for ( w = 0; w < nWords; w++ )
            pOut[w] = pIn1[w] & pIn2[w];
}